

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenuadaptor.cpp
# Opt level: O0

bool __thiscall QDBusMenuAdaptor::AboutToShow(QDBusMenuAdaptor *this,int id)

{
  bool bVar1;
  QDBusPlatformMenuItem *this_00;
  QPlatformMenu *pQVar2;
  int in_ESI;
  QLoggingCategory *in_RDI;
  long in_FS_OFFSET;
  QDBusPlatformMenu *menu;
  QDBusPlatformMenuItem *item;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  QDebug local_20;
  undefined1 *local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  QtPrivateLogging::qLcMenu();
  anon_unknown.dwarf_1e2e9c4::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            (in_stack_ffffffffffffffa0,in_RDI);
  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
    anon_unknown.dwarf_1e2e9c4::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xae895c);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_ESI,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffa8,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
               (char *)in_RDI,(char *)0xae8972);
    QMessageLogger::debug();
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffffa0,(int)((ulong)in_RDI >> 0x20));
    QDebug::~QDebug(&local_20);
    local_10 = 0;
  }
  if (in_ESI == 0) {
    QPlatformMenu::aboutToShow((QPlatformMenu *)0xae89b4);
  }
  else {
    this_00 = QDBusPlatformMenuItem::byId((int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    if ((this_00 != (QDBusPlatformMenuItem *)0x0) &&
       (pQVar2 = QDBusPlatformMenuItem::menu((QDBusPlatformMenuItem *)this_00),
       pQVar2 != (QPlatformMenu *)0x0)) {
      QPlatformMenu::aboutToShow((QPlatformMenu *)0xae89ed);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return false;
}

Assistant:

bool QDBusMenuAdaptor::AboutToShow(int id)
{
    qCDebug(qLcMenu) << id;
    if (id == 0) {
        emit m_topLevelMenu->aboutToShow();
    } else {
        QDBusPlatformMenuItem *item = QDBusPlatformMenuItem::byId(id);
        if (item) {
            const QDBusPlatformMenu *menu = static_cast<const QDBusPlatformMenu *>(item->menu());
            if (menu)
                emit const_cast<QDBusPlatformMenu *>(menu)->aboutToShow();
        }
    }
    return false;  // updateNeeded (we don't know that, so false)
}